

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O2

void __thiscall hiberlite::Database::createModel(Database *this)

{
  bool bVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  logic_error *this_00;
  _Self __tmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  Model mdl;
  string local_70;
  string query;
  
  if (this->mx != (ModelExtractor *)0x0) {
    ModelExtractor::getModel(&mdl,this->mx);
    for (p_Var3 = mdl.
                  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table>_>_>
                  ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 !=
        &mdl.
         super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table>_>_>
         ._M_t._M_impl.super__Rb_tree_header; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      std::operator+(&local_c0,"CREATE TABLE ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var3 + 2));
      std::operator+(&query,&local_c0," (");
      std::__cxx11::string::~string((string *)&local_c0);
      p_Var2 = p_Var3[3]._M_right;
      bVar1 = false;
      while (p_Var2 != (_Base_ptr)&p_Var3[3]._M_parent) {
        if (bVar1) {
          std::__cxx11::string::append((char *)&query);
        }
        std::operator+(&local_c0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var2 + 2)," ");
        std::__cxx11::string::append((string *)&query);
        std::__cxx11::string::~string((string *)&local_c0);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(p_Var2 + 2),"hiberlite_id");
        if (bVar1) {
          std::__cxx11::string::append((char *)&query);
        }
        else {
          std::__cxx11::string::append((string *)&query);
        }
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
        bVar1 = true;
      }
      std::__cxx11::string::append((char *)&query);
      std::__cxx11::string::string((string *)&local_70,(string *)&query);
      dbExecQuery(this,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&query);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table>_>_>
                 *)&mdl);
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"register bean classes first");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void Database::createModel()
{
	if(!mx)
		throw std::logic_error("register bean classes first");
	Model mdl=mx->getModel();
	for(Model::iterator it=mdl.begin();it!=mdl.end();it++){
		Table& t=it->second;
		std::string query="CREATE TABLE "+t.name+" (";
		bool needComma=false;
		for(std::map<std::string,Column>::iterator c=t.columns.begin();c!=t.columns.end();c++){
			if(needComma)
				query+=", ";
			needComma=true;
			Column& col=c->second;
			query += col.name + " ";
			if(col.name==HIBERLITE_PRIMARY_KEY_COLUMN)
				query+="INTEGER PRIMARY KEY AUTOINCREMENT";
			else
				query+=col.storage_type;
		}
		query +=");";
		dbExecQuery(query);
	}
}